

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-actions.h
# Opt level: O1

Result __thiscall
testing::Action<bool_(unsigned_short)>::Perform
          (Action<bool_(unsigned_short)> *this,ArgumentTuple *args)

{
  bool bVar1;
  undefined8 in_RAX;
  undefined8 uStack_18;
  
  uStack_18 = in_RAX;
  if ((this->fun_).super__Function_base._M_manager == (_Manager_type)0x0) {
    internal::IllegalDoDefault
              ("/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/googletest/repo/googlemock/include/gmock/gmock-actions.h"
               ,0x1f0);
  }
  uStack_18 = CONCAT26((args->super__Tuple_impl<0UL,_unsigned_short>).
                       super__Head_base<0UL,_unsigned_short,_false>._M_head_impl,
                       (undefined6)uStack_18);
  if ((this->fun_).super__Function_base._M_manager != (_Manager_type)0x0) {
    bVar1 = (*(this->fun_)._M_invoker)((_Any_data *)this,(unsigned_short *)((long)&uStack_18 + 6));
    return bVar1;
  }
  std::__throw_bad_function_call();
}

Assistant:

Result Perform(ArgumentTuple args) const {
    if (IsDoDefault()) {
      internal::IllegalDoDefault(__FILE__, __LINE__);
    }
    return internal::Apply(fun_, ::std::move(args));
  }